

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O3

void yajl_tree_free(yajl_val v)

{
  char *pcVar1;
  size_t __n;
  yajl_val *ppyVar2;
  char *pcVar3;
  anon_union_32_4_9ecb9ae1_for_u *paVar4;
  
  if (v == (yajl_val)0x0) {
    return;
  }
  switch(v->type) {
  case yajl_t_string:
    pcVar3 = (v->u).string;
    if (pcVar3 == (char *)0x0) {
      __n = 0;
    }
    else {
      __n = strlen(pcVar3);
    }
    paVar4 = &v->u;
    memset(pcVar3,0,__n);
    break;
  case yajl_t_number:
    paVar4 = (anon_union_32_4_9ecb9ae1_for_u *)&(v->u).number.r;
    break;
  case yajl_t_object:
    if ((v->u).number.r != (char *)0x0) {
      pcVar3 = (char *)0x0;
      do {
        free(*(void **)((v->u).string + (long)pcVar3 * 8));
        pcVar1 = (v->u).string + (long)pcVar3 * 8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        yajl_tree_free((v->u).object.values[(long)pcVar3]);
        (v->u).object.values[(long)pcVar3] = (yajl_val)0x0;
        pcVar3 = pcVar3 + 1;
      } while (pcVar3 < (v->u).number.r);
    }
    free((v->u).string);
    paVar4 = (anon_union_32_4_9ecb9ae1_for_u *)&(v->u).object.values;
    break;
  case yajl_t_array:
    paVar4 = &v->u;
    if ((v->u).object.values != (yajl_val *)0x0) {
      ppyVar2 = (yajl_val *)0x0;
      do {
        yajl_tree_free(*(yajl_val *)((v->u).string + (long)ppyVar2 * 8));
        pcVar3 = (v->u).string + (long)ppyVar2 * 8;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        ppyVar2 = (yajl_val *)((long)ppyVar2 + 1);
      } while (ppyVar2 < (v->u).object.values);
    }
    break;
  default:
    goto switchD_00102943_default;
  }
  free(paVar4->string);
switchD_00102943_default:
  free(v);
  return;
}

Assistant:

void yajl_tree_free (yajl_val v)
{
    if (v == NULL) return;

    if (YAJL_IS_STRING(v))
    {
        memset(v->u.string, 0, strlens(v->u.string));
        free(v->u.string);
        free(v);
    }
    else if (YAJL_IS_NUMBER(v))
    {
        free(v->u.number.r);
        free(v);
    }
    else if (YAJL_GET_OBJECT(v))
    {
        yajl_object_free(v);
    }
    else if (YAJL_GET_ARRAY(v))
    {
        yajl_array_free(v);
    }
    else /* if (yajl_t_true or yajl_t_false or yajl_t_null) */
    {
        free(v);
    }
}